

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_6::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  uint uVar1;
  bool bVar2;
  JavaType JVar3;
  uint32 i32;
  FieldType type;
  Type TVar4;
  int iVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  size_t u64;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  int bitIndex_05;
  int bitIndex_06;
  int bitIndex_07;
  int bitIndex_08;
  int bitIndex_09;
  int bitIndex_10;
  int bitIndex_11;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_138;
  allocator local_112;
  allocator local_111;
  key_type local_110;
  string capitalized_type;
  key_type local_c0;
  key_type local_a0;
  allocator local_79;
  key_type local_78;
  uint local_54;
  key_type local_50;
  
  local_54 = messageBitIndex;
  SetCommonFieldVariables(descriptor,info,variables);
  JVar3 = GetJavaType(descriptor);
  PrimitiveTypeName(JVar3);
  std::__cxx11::string::string((string *)&capitalized_type,"type",(allocator *)&local_c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&capitalized_type);
  BoxedPrimitiveTypeName(JVar3);
  std::__cxx11::string::string((string *)&capitalized_type,"boxed_type",(allocator *)&local_c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&capitalized_type);
  std::__cxx11::string::string((string *)&capitalized_type,"type",(allocator *)&bStack_138);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,&capitalized_type);
  std::__cxx11::string::string((string *)&local_c0,"field_type",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&capitalized_type);
  if (JVar3 < JAVATYPE_STRING) {
    pcVar7 = PrimitiveTypeName(JVar3);
    std::__cxx11::string::string((string *)&local_c0,pcVar7,(allocator *)&bStack_138);
    UnderscoresToCamelCase(&capitalized_type,&local_c0,true);
    std::__cxx11::string::~string((string *)&local_c0);
    std::operator+(&bStack_138,"com.google.protobuf.Internal.",&capitalized_type);
    std::operator+(&local_c0,&bStack_138,"List");
    std::__cxx11::string::string((string *)&local_110,"field_list_type",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::operator+(&bStack_138,"empty",&capitalized_type);
    std::operator+(&local_c0,&bStack_138,"List()");
    std::__cxx11::string::string((string *)&local_110,"empty_list",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::operator+(&bStack_138,"new",&capitalized_type);
    std::operator+(&local_c0,&bStack_138,"List()");
    std::__cxx11::string::string((string *)&local_110,"create_list",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::operator+(&bStack_138,"mutableCopy(",pmVar6);
    std::operator+(&local_c0,&bStack_138,"_)");
    std::__cxx11::string::string((string *)&local_a0,"mutable_copy_list",(allocator *)&local_50);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&bStack_138,"name",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::operator+(&local_c0,pmVar6,"_.makeImmutable()");
    std::__cxx11::string::string((string *)&local_110,"name_make_immutable",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::operator+(&bStack_138,pmVar6,"_.get");
    std::operator+(&local_c0,&bStack_138,&capitalized_type);
    std::__cxx11::string::string((string *)&local_a0,"repeated_get",(allocator *)&local_50);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::operator+(&bStack_138,pmVar6,"_.add");
    std::operator+(&local_c0,&bStack_138,&capitalized_type);
    std::__cxx11::string::string((string *)&local_a0,"repeated_add",(allocator *)&local_50);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::operator+(&bStack_138,pmVar6,"_.set");
    std::operator+(&local_c0,&bStack_138,&capitalized_type);
    std::__cxx11::string::string((string *)&local_a0,"repeated_set",(allocator *)&local_50);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    psVar8 = &capitalized_type;
  }
  else {
    std::__cxx11::string::string((string *)&bStack_138,"boxed_type",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::operator+(&local_c0,"java.util.List<",pmVar6);
    std::operator+(&capitalized_type,&local_c0,">");
    std::__cxx11::string::string((string *)&local_110,"field_list_type",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::string((string *)&bStack_138,"boxed_type",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::operator+(&local_c0,"new java.util.ArrayList<",pmVar6);
    std::operator+(&capitalized_type,&local_c0,">()");
    std::__cxx11::string::string((string *)&local_110,"create_list",(allocator *)&local_78);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::string((string *)&local_a0,"boxed_type",&local_111);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::operator+(&local_110,"new java.util.ArrayList<",pmVar6);
    std::operator+(&bStack_138,&local_110,">(");
    std::__cxx11::string::string((string *)&local_78,"name",&local_112);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_78);
    std::operator+(&local_c0,&bStack_138,pmVar6);
    std::operator+(&capitalized_type,&local_c0,"_)");
    std::__cxx11::string::string((string *)&local_50,"mutable_copy_list",&local_79);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_50);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&capitalized_type,"empty_list",(allocator *)&local_c0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&capitalized_type);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_50);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::operator+(&bStack_138,pmVar6,"_ = java.util.Collections.unmodifiableList(");
    std::__cxx11::string::string((string *)&local_a0,"name",&local_111);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::operator+(&local_c0,&bStack_138,pmVar6);
    std::operator+(&capitalized_type,&local_c0,"_)");
    std::__cxx11::string::string((string *)&local_78,"name_make_immutable",&local_112);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_78);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_110);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&capitalized_type,pmVar6,"_.get");
    std::__cxx11::string::string((string *)&bStack_138,"repeated_get",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_110);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&capitalized_type,pmVar6,"_.add");
    std::__cxx11::string::string((string *)&bStack_138,"repeated_add",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_110);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&capitalized_type,pmVar6,"_.set");
    std::__cxx11::string::string((string *)&bStack_138,"repeated_set",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&capitalized_type);
    psVar8 = &local_c0;
  }
  std::__cxx11::string::~string((string *)psVar8);
  ImmutableDefaultValue_abi_cxx11_
            (&capitalized_type,(java *)descriptor,(FieldDescriptor *)name_resolver,
             (ClassNameResolver *)info);
  std::__cxx11::string::string((string *)&local_c0,"default",(allocator *)&bStack_138);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&capitalized_type);
  bVar2 = IsDefaultValueJavaDefault(descriptor);
  if (bVar2) {
    std::__cxx11::string::string((string *)&capitalized_type,"",(allocator *)&local_c0);
  }
  else {
    ImmutableDefaultValue_abi_cxx11_
              (&local_c0,(java *)descriptor,(FieldDescriptor *)name_resolver,
               (ClassNameResolver *)info);
    std::operator+(&capitalized_type,"= ",&local_c0);
  }
  std::__cxx11::string::string((string *)&bStack_138,"default_init",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  if (!bVar2) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  GetCapitalizedType(descriptor,true);
  std::__cxx11::string::string
            ((string *)&capitalized_type,"capitalized_type",(allocator *)&bStack_138);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&capitalized_type);
  i32 = internal::WireFormat::MakeTag(descriptor);
  strings::AlphaNum::AlphaNum((AlphaNum *)&capitalized_type,i32);
  StrCat_abi_cxx11_(&bStack_138,(protobuf *)&capitalized_type,a);
  std::__cxx11::string::string((string *)&local_110,"tag",(allocator *)&local_a0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&bStack_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&bStack_138);
  iVar5 = *(int *)(descriptor + 0x44);
  type = GetType(descriptor);
  u64 = internal::WireFormatLite::TagSize(iVar5,type);
  strings::AlphaNum::AlphaNum((AlphaNum *)&capitalized_type,u64);
  StrCat_abi_cxx11_(&bStack_138,(protobuf *)&capitalized_type,a_00);
  std::__cxx11::string::string((string *)&local_110,"tag_size",(allocator *)&local_a0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&bStack_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&bStack_138);
  JVar3 = GetJavaType(descriptor);
  bVar2 = IsReferenceType(JVar3);
  if (bVar2) {
    std::__cxx11::string::string((string *)&capitalized_type,"null_check",(allocator *)&bStack_138);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&capitalized_type);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  else {
    std::__cxx11::string::string((string *)&capitalized_type,"null_check",(allocator *)&bStack_138);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&capitalized_type);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  std::__cxx11::string::~string((string *)&capitalized_type);
  std::__cxx11::string::string((string *)&capitalized_type,"deprecation",(allocator *)&bStack_138);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&capitalized_type);
  TVar4 = GetType(descriptor);
  iVar5 = FixedSize(TVar4);
  if (iVar5 != -1) {
    strings::AlphaNum::AlphaNum((AlphaNum *)&capitalized_type,iVar5);
    StrCat_abi_cxx11_(&bStack_138,(protobuf *)&capitalized_type,a_01);
    std::__cxx11::string::string((string *)&local_110,"fixed_size",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&bStack_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&bStack_138);
  }
  std::__cxx11::string::string((string *)&capitalized_type,"on_changed",(allocator *)&bStack_138);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  uVar1 = local_54;
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&capitalized_type);
  if (*(int *)(*(long *)(descriptor + 0x28) + 0x3c) == 3) {
    std::__cxx11::string::string
              ((string *)&capitalized_type,"set_has_field_bit_message",(allocator *)&bStack_138);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&capitalized_type);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::string
              ((string *)&capitalized_type,"set_has_field_bit_builder",(allocator *)&bStack_138);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&capitalized_type);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::string
              ((string *)&capitalized_type,"clear_has_field_bit_builder",(allocator *)&bStack_138);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&capitalized_type);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&capitalized_type);
    TVar4 = FieldDescriptor::type(descriptor);
    if (TVar4 == TYPE_BYTES) {
      std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_78);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_110);
      std::operator+(&bStack_138,"!",pmVar6);
      std::operator+(&capitalized_type,&bStack_138,"_.isEmpty()");
      std::__cxx11::string::string
                ((string *)&local_a0,"is_field_present_message",(allocator *)&local_50);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      psVar8 = &capitalized_type;
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      std::__cxx11::string::string((string *)&local_110,"name",(allocator *)&local_50);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_110);
      std::operator+(&bStack_138,pmVar6,"_ != ");
      std::__cxx11::string::string((string *)&local_a0,"default",&local_111);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      std::operator+(&capitalized_type,&bStack_138,pmVar6);
      std::__cxx11::string::string((string *)&local_78,"is_field_present_message",&local_112);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_78);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&capitalized_type);
      psVar8 = &local_a0;
    }
    std::__cxx11::string::~string((string *)psVar8);
    std::__cxx11::string::~string((string *)&bStack_138);
    psVar8 = &local_110;
  }
  else {
    GenerateGetBit_abi_cxx11_(&capitalized_type,(java *)(ulong)uVar1,bitIndex);
    std::__cxx11::string::string
              ((string *)&bStack_138,"get_has_field_bit_message",(allocator *)&local_110);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&capitalized_type);
    GenerateGetBit_abi_cxx11_(&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_00);
    std::__cxx11::string::string
              ((string *)&bStack_138,"get_has_field_bit_builder",(allocator *)&local_110);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    std::__cxx11::string::~string((string *)&capitalized_type);
    GenerateSetBit_abi_cxx11_(&bStack_138,(java *)(ulong)uVar1,bitIndex_01);
    std::operator+(&capitalized_type,&bStack_138,";");
    std::__cxx11::string::string
              ((string *)&local_110,"set_has_field_bit_message",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    GenerateSetBit_abi_cxx11_(&bStack_138,(java *)(ulong)(uint)builderBitIndex,bitIndex_02);
    std::operator+(&capitalized_type,&bStack_138,";");
    std::__cxx11::string::string
              ((string *)&local_110,"set_has_field_bit_builder",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    GenerateClearBit_abi_cxx11_(&bStack_138,(java *)(ulong)(uint)builderBitIndex,bitIndex_03);
    std::operator+(&capitalized_type,&bStack_138,";");
    std::__cxx11::string::string
              ((string *)&local_110,"clear_has_field_bit_builder",(allocator *)&local_a0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&capitalized_type);
    std::__cxx11::string::~string((string *)&bStack_138);
    GenerateGetBit_abi_cxx11_(&capitalized_type,(java *)(ulong)uVar1,bitIndex_04);
    std::__cxx11::string::string
              ((string *)&bStack_138,"is_field_present_message",(allocator *)&local_110);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&bStack_138);
    psVar8 = &capitalized_type;
    std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar8);
    std::__cxx11::string::~string((string *)&bStack_138);
  }
  std::__cxx11::string::~string((string *)psVar8);
  GenerateGetBit_abi_cxx11_(&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_05);
  std::__cxx11::string::string
            ((string *)&bStack_138,"get_mutable_bit_builder",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GenerateSetBit_abi_cxx11_(&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_06);
  std::__cxx11::string::string
            ((string *)&bStack_138,"set_mutable_bit_builder",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GenerateClearBit_abi_cxx11_(&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_07);
  std::__cxx11::string::string
            ((string *)&bStack_138,"clear_mutable_bit_builder",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GenerateGetBitMutableLocal_abi_cxx11_
            (&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_08);
  std::__cxx11::string::string
            ((string *)&bStack_138,"get_mutable_bit_parser",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GenerateSetBitMutableLocal_abi_cxx11_
            (&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_09);
  std::__cxx11::string::string
            ((string *)&bStack_138,"set_mutable_bit_parser",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GenerateGetBitFromLocal_abi_cxx11_
            (&capitalized_type,(java *)(ulong)(uint)builderBitIndex,bitIndex_10);
  std::__cxx11::string::string
            ((string *)&bStack_138,"get_has_field_bit_from_local",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GenerateSetBitToLocal_abi_cxx11_(&capitalized_type,(java *)(ulong)uVar1,bitIndex_11);
  std::__cxx11::string::string
            ((string *)&bStack_138,"set_has_field_bit_to_local",(allocator *)&local_110);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&bStack_138);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&bStack_138);
  std::__cxx11::string::~string((string *)&capitalized_type);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex, int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);
  JavaType javaType = GetJavaType(descriptor);
  (*variables)["type"] = PrimitiveTypeName(javaType);
  (*variables)["boxed_type"] = BoxedPrimitiveTypeName(javaType);
  (*variables)["field_type"] = (*variables)["type"];
  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] =
      GetCapitalizedType(descriptor, /* immutable = */ true);
  (*variables)["tag"] =
      StrCat(static_cast<int32>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";

  std::string capitalized_type = UnderscoresToCamelCase(
      PrimitiveTypeName(javaType), true /* cap_next_letter */);
  switch (javaType) {
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
      (*variables)["field_list_type"] =
          "com.google.protobuf.Internal." + capitalized_type + "List";
      (*variables)["empty_list"] = "empty" + capitalized_type + "List()";
      (*variables)["make_name_unmodifiable"] =
          (*variables)["name"] + "_.makeImmutable()";
      (*variables)["repeated_get"] =
          (*variables)["name"] + "_.get" + capitalized_type;
      (*variables)["repeated_add"] =
          (*variables)["name"] + "_.add" + capitalized_type;
      (*variables)["repeated_set"] =
          (*variables)["name"] + "_.set" + capitalized_type;
      (*variables)["visit_type"] = capitalized_type;
      (*variables)["visit_type_list"] = "visit" + capitalized_type + "List";
      break;
    default:
      (*variables)["field_list_type"] =
          "com.google.protobuf.Internal.ProtobufList<" +
          (*variables)["boxed_type"] + ">";
      (*variables)["empty_list"] = "emptyProtobufList()";
      (*variables)["make_name_unmodifiable"] =
          (*variables)["name"] + "_.makeImmutable()";
      (*variables)["repeated_get"] = (*variables)["name"] + "_.get";
      (*variables)["repeated_add"] = (*variables)["name"] + "_.add";
      (*variables)["repeated_set"] = (*variables)["name"] + "_.set";
      (*variables)["visit_type"] = "ByteString";
      (*variables)["visit_type_list"] = "visitList";
  }

  if (javaType == JAVATYPE_BYTES) {
    (*variables)["bytes_default"] =
        ToUpper((*variables)["name"]) + "_DEFAULT_VALUE";
  }

  if (IsReferenceType(javaType)) {
    (*variables)["null_check"] =
        "  if (value == null) {\n"
        "    throw new NullPointerException();\n"
        "  }\n";
  } else {
    (*variables)["null_check"] = "";
  }
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  int fixed_size = FixedSize(GetType(descriptor));
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = StrCat(fixed_size);
  }

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["clear_has_field_bit_message"] =
        GenerateClearBit(messageBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    if (descriptor->type() == FieldDescriptor::TYPE_BYTES) {
      (*variables)["is_field_present_message"] =
          "!" + (*variables)["name"] + "_.isEmpty()";
    } else {
      (*variables)["is_field_present_message"] =
          (*variables)["name"] + "_ != " + (*variables)["default"];
    }
  }

  // For repeated builders, the underlying list tracks mutability state.
  (*variables)["is_mutable"] = (*variables)["name"] + "_.isModifiable()";

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}